

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O3

void sexp_bignum_split(sexp ctx,sexp a,sexp_uint_t k,sexp_conflict *lo,sexp_conflict *hi)

{
  sexp_conflict psVar1;
  ulong uVar2;
  ulong uVar3;
  sexp psVar4;
  sexp *ppsVar5;
  sexp_uint_t sVar6;
  
  uVar2 = (a->value).string.offset;
  do {
    uVar3 = uVar2;
    if (uVar3 == 1) break;
    uVar2 = uVar3 - 1;
  } while (*(long *)((long)&a->value + uVar3 * 8 + 8) == 0);
  psVar4 = sexp_make_bignum(ctx,k);
  *lo = psVar4;
  psVar4 = sexp_make_bignum(ctx,(uVar3 - k) + 1);
  *hi = psVar4;
  if (k != 0) {
    psVar1 = *lo;
    sVar6 = 0;
    do {
      *(undefined8 *)((long)&psVar1->value + sVar6 * 8 + 0x10) =
           *(undefined8 *)((long)&a->value + sVar6 * 8 + 0x10);
      sVar6 = sVar6 + 1;
    } while (k != sVar6);
  }
  if (k < uVar3) {
    ppsVar5 = &(psVar4->value).type.slots;
    do {
      *ppsVar5 = *(sexp *)((long)&a->value + k * 8 + 0x10);
      k = k + 1;
      ppsVar5 = ppsVar5 + 1;
    } while (k < uVar3);
  }
  return;
}

Assistant:

static void sexp_bignum_split (sexp ctx, sexp a, sexp_uint_t k, sexp* lo, sexp* hi) {
  sexp_uint_t alen=sexp_bignum_hi(a), i, *adata=sexp_bignum_data(a),
    *lodata, *hidata;
  *lo = sexp_make_bignum(ctx, k);        /* must be gc protected by caller */
  *hi = sexp_make_bignum(ctx, alen-k+1);
  lodata = sexp_bignum_data(*lo);
  hidata = sexp_bignum_data(*hi);
  for (i=0; i<k; i++)                    /* split into a[0..k-1], a[k..] */
    lodata[i] = adata[i];
  for (i=k; i<alen; i++)
    hidata[i-k] = adata[i];
}